

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O1

void covenant::consume_blanks<covenant::StrParse>(StrParse *input)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = (ulong)input->idx;
  uVar2 = (input->str)._M_string_length;
  if (uVar1 < uVar2) {
    do {
      if ((input->str)._M_dataplus._M_p[uVar1] != ' ') {
        if (uVar2 <= uVar1) {
          return;
        }
        if ((input->str)._M_dataplus._M_p[uVar1] != '\n') {
          if (uVar2 <= uVar1) {
            return;
          }
          if ((input->str)._M_dataplus._M_p[uVar1] != '\t') {
            return;
          }
        }
      }
      StrParse::chomp(input);
      uVar1 = (ulong)input->idx;
      uVar2 = (input->str)._M_string_length;
    } while (uVar1 < uVar2);
  }
  return;
}

Assistant:

bool empty(void) 
  { 
    return idx >= str.size(); 
  }